

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O1

Am_Value __thiscall Am_Input_Char::operator_cast_to_Am_Value(Am_Input_Char *this)

{
  Am_ID_Tag *in_RDI;
  Am_Value AVar1;
  
  AVar1.value.long_value = (long)this->code | (ulong)((*(ushort *)&this->field_0x2 & 0xfff) << 0x10)
  ;
  *in_RDI = Am_Input_Char_ID;
  ((anon_union_8_8_ea4c8939_for_value *)(in_RDI + 4))->long_value = (long)AVar1.value;
  AVar1._0_8_ = in_RDI;
  return AVar1;
}

Assistant:

Am_Input_Char::operator Am_Value() const
{
  long l;
  l = click_count;
  l = (l << 4) | button_down;
  l = (l << 1) | (any_modifier & 1); // The Mac stores these values as full
  l = (l << 1) | (meta & 1);         // ints.  Pick out just the lowest bit.
  l = (l << 1) | (control & 1);
  l = (l << 1) | (shift & 1);
  l = (l << 16) | code;
  return Am_Value(l, Am_Input_Char_ID);
}